

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_OpenDoor(FParser *this)

{
  int tag;
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (this->t_argc < 1) {
    script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
    return;
  }
  tag = intvalue(this->t_argv);
  if (tag != 0) {
    iVar1 = 0;
    if (1 < this->t_argc) {
      iVar1 = intvalue(this->t_argv + 1);
      iVar1 = (iVar1 * 0x23) / 100;
    }
    iVar2 = 1;
    if (2 < this->t_argc) {
      iVar2 = intvalue(this->t_argv + 2);
    }
    iVar3 = 0x7f;
    if (iVar2 < 0x7f) {
      iVar3 = iVar2;
    }
    iVar2 = 1;
    if (1 < iVar3) {
      iVar2 = iVar3;
    }
    EV_DoDoor(doorRaise - (iVar1 == 0),(line_t_conflict *)0x0,(AActor *)0x0,tag,(double)(iVar2 * 2),
              iVar1,0,0,false,0);
  }
  return;
}

Assistant:

void FParser::SF_OpenDoor(void)
{
	int speed, wait_time;
	int sectag;
	
	if (CheckArgs(1))
	{
		// got sector tag
		sectag = intvalue(t_argv[0]);
		if (sectag==0) return;	// tag 0 not allowed
		
		// door wait time
		if(t_argc > 1) wait_time = (intvalue(t_argv[1]) * TICRATE) / 100;
		else wait_time = 0;  // 0= stay open
		
		// door speed
		if(t_argc > 2) speed = intvalue(t_argv[2]);
		else speed = 1;    // 1= normal speed

		EV_DoDoor(wait_time ? DDoor::doorRaise : DDoor::doorOpen, NULL, NULL, sectag, 2. * clamp(speed, 1, 127), wait_time, 0, 0);
	}
}